

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belongingStructure.cpp
# Opt level: O2

void pushNew(BelongStructure *bs,float atk,int *belonging)

{
  int i;
  long lVar1;
  float atk_local;
  int *ptr;
  
  if (bs->biggestAtk - (float)nearing_coef <= atk) {
    atk_local = atk;
    ptr = (int *)operator_new__(0x40);
    for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
      ptr[lVar1] = belonging[lVar1];
    }
    std::vector<int_*,_std::allocator<int_*>_>::push_back(&bs->belongings,&ptr);
    std::vector<float,_std::allocator<float>_>::push_back(&bs->as,&atk_local);
  }
  return;
}

Assistant:

void pushNew(BelongStructure *bs,float atk,int *belonging){
        if(atk<bs->biggestAtk-nearing_coef)return;
        int *ptr = new int[16];
        for(int i=0;i<16;i++)
            ptr[i]=belonging[i];
        bs->belongings.push_back(ptr);
        bs->as.push_back(atk);
    }